

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::Encrypt
          (LegacyScriptPubKeyMan *this,CKeyingMaterial *master_key,WalletBatch *batch)

{
  long lVar1;
  bool bVar2;
  reference ppVar3;
  uint256 *nIV;
  CPubKey *this_00;
  undefined8 in_RDX;
  CKey *in_RSI;
  allocator_type *in_RDI;
  long in_FS_OFFSET;
  CKey *key;
  value_type *mKey;
  KeyMap *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchCryptedSecret;
  CKeyingMaterial vchSecret;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  CPubKey vchPubKey;
  KeyMap keys_to_encrypt;
  CKey *in_stack_fffffffffffffe78;
  undefined5 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe85;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  CKey *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe98;
  CKey *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  CKeyingMaterial *in_stack_fffffffffffffeb8;
  vector<unsigned_char,_secure_allocator<unsigned_char>_> *in_stack_fffffffffffffec0;
  CKey *__first;
  allocator_type *vchCryptedSecret_00;
  undefined7 in_stack_ffffffffffffff00;
  byte in_stack_ffffffffffffff07;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffff08;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  vchCryptedSecret_00 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffeb8,
             (AnnotatedMixin<std::recursive_mutex> *)in_RDI,in_stack_fffffffffffffea8,
             &in_stack_fffffffffffffea0->fCompressed,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20)
             ,SUB81((ulong)in_stack_fffffffffffffe98 >> 0x18,0));
  *(undefined8 *)(in_RDI + 0x328) = in_RDX;
  bVar2 = std::
          map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::empty((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                   *)in_stack_fffffffffffffe78);
  if (bVar2) {
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::map
              ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)in_stack_fffffffffffffe78);
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::swap
              ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)in_stack_fffffffffffffe78,
               (map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)0x166708c);
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::
    begin((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_> *)
          CONCAT17(in_stack_fffffffffffffe87,
                   CONCAT16(in_stack_fffffffffffffe86,
                            CONCAT15(in_stack_fffffffffffffe85,in_stack_fffffffffffffe80))));
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::end
              ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)CONCAT17(in_stack_fffffffffffffe87,
                           CONCAT16(in_stack_fffffffffffffe86,
                                    CONCAT15(in_stack_fffffffffffffe85,in_stack_fffffffffffffe80))))
    ;
    while( true ) {
      bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe88,
                              (_Self *)CONCAT17(in_stack_fffffffffffffe87,
                                                CONCAT16(in_stack_fffffffffffffe86,
                                                         CONCAT15(in_stack_fffffffffffffe85,
                                                                  in_stack_fffffffffffffe80))));
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_> *)
                          in_stack_fffffffffffffe78);
      __first = &ppVar3->second;
      CKey::GetPubKey(in_stack_fffffffffffffea0);
      nIV = (uint256 *)CKey::begin(in_stack_fffffffffffffe78);
      in_stack_fffffffffffffea0 = (CKey *)UCharCast(&in_stack_fffffffffffffe78->fCompressed);
      this_00 = (CPubKey *)CKey::end(in_stack_fffffffffffffe88);
      UCharCast(&in_stack_fffffffffffffe78->fCompressed);
      std::vector<unsigned_char,secure_allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                (in_stack_fffffffffffffec0,&__first->fCompressed,(uchar *)in_stack_fffffffffffffeb8,
                 in_RDI);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe78)
      ;
      in_stack_fffffffffffffe88 = in_RSI;
      CPubKey::GetHash(this_00);
      in_stack_fffffffffffffe87 =
           EncryptSecret(in_stack_fffffffffffffeb8,(CKeyingMaterial *)in_RDI,nIV,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffea0);
      if (((in_stack_fffffffffffffe87 ^ 0xff) & 1) == 0) {
        in_stack_fffffffffffffe86 =
             AddCryptedKey(in_stack_ffffffffffffff08,
                           (CPubKey *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           vchCryptedSecret_00);
        if ((bool)in_stack_fffffffffffffe86) {
          bVar2 = false;
        }
        else {
          *(undefined8 *)(in_RDI + 0x328) = 0;
          in_stack_ffffffffffffff07 = 0;
          bVar2 = true;
        }
      }
      else {
        *(undefined8 *)(in_RDI + 0x328) = 0;
        in_stack_ffffffffffffff07 = 0;
        bVar2 = true;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe88)
      ;
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe88);
      if (bVar2) goto LAB_016672f1;
      std::_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_> *)in_stack_fffffffffffffe78);
    }
    *(undefined8 *)(in_RDI + 0x328) = 0;
    in_stack_ffffffffffffff07 = 1;
LAB_016672f1:
    std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::~map
              ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                *)in_stack_fffffffffffffe78);
  }
  else {
    *(undefined8 *)(in_RDI + 0x328) = 0;
    in_stack_ffffffffffffff07 = 0;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(in_stack_ffffffffffffff07 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::Encrypt(const CKeyingMaterial& master_key, WalletBatch* batch)
{
    LOCK(cs_KeyStore);
    encrypted_batch = batch;
    if (!mapCryptedKeys.empty()) {
        encrypted_batch = nullptr;
        return false;
    }

    KeyMap keys_to_encrypt;
    keys_to_encrypt.swap(mapKeys); // Clear mapKeys so AddCryptedKeyInner will succeed.
    for (const KeyMap::value_type& mKey : keys_to_encrypt)
    {
        const CKey &key = mKey.second;
        CPubKey vchPubKey = key.GetPubKey();
        CKeyingMaterial vchSecret{UCharCast(key.begin()), UCharCast(key.end())};
        std::vector<unsigned char> vchCryptedSecret;
        if (!EncryptSecret(master_key, vchSecret, vchPubKey.GetHash(), vchCryptedSecret)) {
            encrypted_batch = nullptr;
            return false;
        }
        if (!AddCryptedKey(vchPubKey, vchCryptedSecret)) {
            encrypted_batch = nullptr;
            return false;
        }
    }
    encrypted_batch = nullptr;
    return true;
}